

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,SourceColorSpace v)

{
  int iVar1;
  SourceColorSpace v_local;
  string *s;
  
  iVar1 = (int)this;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (iVar1 == 0) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"auto");
  }
  else if (iVar1 == 1) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"raw");
  }
  else if (iVar1 == 2) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"sRGB");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const tinyusdz::UsdUVTexture::SourceColorSpace v) {
  std::string s;

  switch (v) {
    case tinyusdz::UsdUVTexture::SourceColorSpace::Auto: {
      s = "auto";
      break;
    }
    case tinyusdz::UsdUVTexture::SourceColorSpace::Raw: {
      s = "raw";
      break;
    }
    case tinyusdz::UsdUVTexture::SourceColorSpace::SRGB: {
      s = "sRGB";
      break;
    }
  }

  return s;
}